

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

gzFile gz_open(void *path,int fd,char *mode)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  __off64_t _Var7;
  int local_5c;
  uint local_58;
  int exclusive;
  int cloexec;
  int oflag;
  z_size_t len;
  gz_statep state;
  char *mode_local;
  int fd_local;
  void *path_local;
  
  bVar1 = false;
  bVar2 = false;
  if (path == (void *)0x0) {
    path_local = (void *)0x0;
  }
  else {
    path_local = malloc(0xf0);
    if ((gz_statep)path_local == (gz_statep)0x0) {
      path_local = (void *)0x0;
    }
    else {
      ((gz_statep)path_local)->size = 0;
      ((gz_statep)path_local)->want = 0x2000;
      ((gz_statep)path_local)->msg = (char *)0x0;
      ((gz_statep)path_local)->mode = 0;
      ((gz_statep)path_local)->level = -1;
      ((gz_statep)path_local)->strategy = 0;
      ((gz_statep)path_local)->direct = 0;
      state = (gz_statep)mode;
      while ((char)(state->x).have != '\0') {
        if (((char)(state->x).have < '0') || ('9' < (char)(state->x).have)) {
          switch((char)(state->x).have) {
          case '+':
            free(path_local);
            return (gzFile)0x0;
          default:
            break;
          case 'F':
            ((gz_statep)path_local)->strategy = 4;
            break;
          case 'R':
            ((gz_statep)path_local)->strategy = 3;
            break;
          case 'T':
            ((gz_statep)path_local)->direct = 1;
            break;
          case 'a':
            ((gz_statep)path_local)->mode = 1;
            break;
          case 'b':
            break;
          case 'e':
            bVar1 = true;
            break;
          case 'f':
            ((gz_statep)path_local)->strategy = 1;
            break;
          case 'h':
            ((gz_statep)path_local)->strategy = 2;
            break;
          case 'r':
            ((gz_statep)path_local)->mode = 0x1c4f;
            break;
          case 'w':
            ((gz_statep)path_local)->mode = 0x79b1;
            break;
          case 'x':
            bVar2 = true;
          }
        }
        else {
          ((gz_statep)path_local)->level = (char)(state->x).have + -0x30;
        }
        state = (gz_statep)((long)&(state->x).have + 1);
      }
      if (((gz_statep)path_local)->mode == 0) {
        free(path_local);
        path_local = (void *)0x0;
      }
      else {
        if (((gz_statep)path_local)->mode == 0x1c4f) {
          if (((gz_statep)path_local)->direct != 0) {
            free(path_local);
            return (gzFile)0x0;
          }
          ((gz_statep)path_local)->direct = 1;
        }
        sVar5 = strlen((char *)path);
        pcVar6 = (char *)malloc(sVar5 + 1);
        ((gz_statep)path_local)->path = pcVar6;
        if (((gz_statep)path_local)->path == (char *)0x0) {
          free(path_local);
          path_local = (void *)0x0;
        }
        else {
          snprintf(((gz_statep)path_local)->path,sVar5 + 1,"%s",path);
          uVar3 = 0;
          if (bVar1) {
            uVar3 = 0x80000;
          }
          if (((gz_statep)path_local)->mode == 0x1c4f) {
            local_58 = 0;
          }
          else {
            uVar4 = 0;
            if (bVar2) {
              uVar4 = 0x80;
            }
            local_58 = 0x400;
            if (((gz_statep)path_local)->mode == 0x79b1) {
              local_58 = 0x200;
            }
            local_58 = uVar4 | 0x41 | local_58;
          }
          local_5c = fd;
          if (fd < 0) {
            local_5c = open64((char *)path,uVar3 | local_58,0x1b6);
          }
          ((gz_statep)path_local)->fd = local_5c;
          if (((gz_statep)path_local)->fd == -1) {
            free(((gz_statep)path_local)->path);
            free(path_local);
            path_local = (void *)0x0;
          }
          else {
            if (((gz_statep)path_local)->mode == 1) {
              lseek64(((gz_statep)path_local)->fd,0,2);
              ((gz_statep)path_local)->mode = 0x79b1;
            }
            if (((gz_statep)path_local)->mode == 0x1c4f) {
              _Var7 = lseek64(((gz_statep)path_local)->fd,0,1);
              ((gz_statep)path_local)->start = _Var7;
              if (((gz_statep)path_local)->start == -1) {
                ((gz_statep)path_local)->start = 0;
              }
            }
            gz_reset((gz_statep)path_local);
          }
        }
      }
    }
  }
  return (gzFile)path_local;
}

Assistant:

local gzFile gz_open(const void *path, int fd, const char *mode) {
    gz_statep state;
    z_size_t len;
    int oflag;
#ifdef O_CLOEXEC
    int cloexec = 0;
#endif
#ifdef O_EXCL
    int exclusive = 0;
#endif

    /* check input */
    if (path == NULL)
        return NULL;

    /* allocate gzFile structure to return */
    state = (gz_statep)malloc(sizeof(gz_state));
    if (state == NULL)
        return NULL;
    state->size = 0;            /* no buffers allocated yet */
    state->want = GZBUFSIZE;    /* requested buffer size */
    state->msg = NULL;          /* no error message yet */

    /* interpret mode */
    state->mode = GZ_NONE;
    state->level = Z_DEFAULT_COMPRESSION;
    state->strategy = Z_DEFAULT_STRATEGY;
    state->direct = 0;
    while (*mode) {
        if (*mode >= '0' && *mode <= '9')
            state->level = *mode - '0';
        else
            switch (*mode) {
            case 'r':
                state->mode = GZ_READ;
                break;
#ifndef NO_GZCOMPRESS
            case 'w':
                state->mode = GZ_WRITE;
                break;
            case 'a':
                state->mode = GZ_APPEND;
                break;
#endif
            case '+':       /* can't read and write at the same time */
                free(state);
                return NULL;
            case 'b':       /* ignore -- will request binary anyway */
                break;
#ifdef O_CLOEXEC
            case 'e':
                cloexec = 1;
                break;
#endif
#ifdef O_EXCL
            case 'x':
                exclusive = 1;
                break;
#endif
            case 'f':
                state->strategy = Z_FILTERED;
                break;
            case 'h':
                state->strategy = Z_HUFFMAN_ONLY;
                break;
            case 'R':
                state->strategy = Z_RLE;
                break;
            case 'F':
                state->strategy = Z_FIXED;
                break;
            case 'T':
                state->direct = 1;
                break;
            default:        /* could consider as an error, but just ignore */
                ;
            }
        mode++;
    }

    /* must provide an "r", "w", or "a" */
    if (state->mode == GZ_NONE) {
        free(state);
        return NULL;
    }

    /* can't force transparent read */
    if (state->mode == GZ_READ) {
        if (state->direct) {
            free(state);
            return NULL;
        }
        state->direct = 1;      /* for empty file */
    }

    /* save the path name for error messages */
#ifdef WIDECHAR
    if (fd == -2) {
        len = wcstombs(NULL, path, 0);
        if (len == (z_size_t)-1)
            len = 0;
    }
    else
#endif
        len = strlen((const char *)path);
    state->path = (char *)malloc(len + 1);
    if (state->path == NULL) {
        free(state);
        return NULL;
    }
#ifdef WIDECHAR
    if (fd == -2)
        if (len)
            wcstombs(state->path, path, len + 1);
        else
            *(state->path) = 0;
    else
#endif
#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
        (void)snprintf(state->path, len + 1, "%s", (const char *)path);
#else
        strcpy(state->path, path);
#endif

    /* compute the flags for open() */
    oflag =
#ifdef O_LARGEFILE
        O_LARGEFILE |
#endif
#ifdef O_BINARY
        O_BINARY |
#endif
#ifdef O_CLOEXEC
        (cloexec ? O_CLOEXEC : 0) |
#endif
        (state->mode == GZ_READ ?
         O_RDONLY :
         (O_WRONLY | O_CREAT |
#ifdef O_EXCL
          (exclusive ? O_EXCL : 0) |
#endif
          (state->mode == GZ_WRITE ?
           O_TRUNC :
           O_APPEND)));

    /* open the file with the appropriate flags (or just use fd) */
    state->fd = fd > -1 ? fd : (
#ifdef WIDECHAR
        fd == -2 ? _wopen(path, oflag, 0666) :
#endif
        OPEN((const char *)path, oflag, 0666));
    if (state->fd == -1) {
        free(state->path);
        free(state);
        return NULL;
    }
    if (state->mode == GZ_APPEND) {
        LSEEK(state->fd, 0, SEEK_END);  /* so gzoffset() is correct */
        state->mode = GZ_WRITE;         /* simplify later checks */
    }

    /* save the current position for rewinding (only if reading) */
    if (state->mode == GZ_READ) {
        state->start = LSEEK(state->fd, 0, SEEK_CUR);
        if (state->start == -1) state->start = 0;
    }

    /* initialize stream */
    gz_reset(state);

    /* return stream */
    return (gzFile)state;
}